

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.cpp
# Opt level: O2

void * IM483IThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  double dVar11;
  int local_844;
  double local_840;
  CHRONO chrono_sail_calibration;
  CHRONO chrono_period;
  char szTemp [256];
  IM483I im483i;
  char szSaveFilePath [256];
  
  memset(&im483i,0,0x568);
  StartChrono(&chrono_sail_calibration);
  StartChrono(&chrono_period);
  iVar9 = 0x32;
  bVar10 = false;
  local_844 = 0;
  do {
    bVar10 = !bVar10;
    while( true ) {
      StopChronoQuick(&chrono_period);
      StartChrono(&chrono_period);
      mSleep((long)iVar9);
      if (bPauseIM483I == 0) break;
      if (!bVar10) {
        puts("IM483I paused.");
        DisconnectIM483I(&im483i);
      }
      if (bExit != 0) goto LAB_0018ba62;
      mSleep(100);
      bVar10 = true;
    }
    if (bRestartIM483I == 0) {
      if (bVar10) goto LAB_0018b70c;
      if (((robid != 0x2000) && (robid != 0x8000)) && (robid != 0x4000)) goto LAB_0018b870;
      dVar11 = GetTimeElapsedChronoQuick(&chrono_sail_calibration);
      if (((dVar11 <= sail_calibration_period) && (bCalibrateSail == 0 || bSailCalibrated != 0)) &&
         (bForceSailCalibration == 0)) {
LAB_0018b99c:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        if (u_f <= 0.0) {
          local_840 = im483i.MinAngle;
        }
        else {
          local_840 = u_f * (im483i.MaxAngle - im483i.MinAngle) + im483i.MinAngle;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar7 = 5;
        while (iVar4 = SetMaxAngleIM483I(&im483i,local_840), iVar4 != 0) {
          bVar10 = iVar7 == 0;
          iVar7 = iVar7 + -1;
          if (bVar10) {
            puts("Connection to a IM483I lost.");
            bSailCalibrated = 0;
            DisconnectIM483I(&im483i);
            goto LAB_0018b729;
          }
          mSleep((long)im483i.timeout);
        }
        bVar2 = false;
        bVar10 = true;
        goto LAB_0018b93c;
      }
      if (((bCalibrateSail != 0) && (bSailCalibrated == 0)) && (bCheckRudder != 0)) {
        mSleep(7000);
      }
      bSailCalibrated = 0;
      iVar7 = CalibrateMotorIM483I(&im483i);
      if (iVar7 == 0) {
        bSailCalibrated = 1;
        bForceSailCalibration = 0;
        StopChronoQuick(&chrono_sail_calibration);
        StartChrono(&chrono_sail_calibration);
        goto LAB_0018b99c;
      }
      puts("Connection to a IM483I lost.");
      bSailCalibrated = 0;
      DisconnectIM483I(&im483i);
LAB_0018b729:
      local_844 = local_844 + 1;
      if (ExitOnErrorCount <= local_844 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_0018ba62:
        bVar2 = true;
        goto LAB_0018ba65;
      }
      bVar10 = false;
      bVar2 = true;
    }
    else {
      if (!bVar10) {
        puts("Restarting a IM483I.");
        DisconnectIM483I(&im483i);
      }
      bRestartIM483I = 0;
LAB_0018b70c:
      iVar4 = ConnectIM483I(&im483i,"IM483I0.txt");
      iVar7 = im483i.threadperiod;
      if (iVar4 != 0) {
        mSleep(1000);
        goto LAB_0018b729;
      }
      bSailCalibrated = 0;
      if (im483i.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)im483i.pfSaveFile);
        im483i.pfSaveFile = (FILE *)0x0;
      }
      iVar9 = iVar7;
      if (im483i.bSaveRawData == 0) {
LAB_0018b870:
        bVar2 = false;
        bVar10 = true;
      }
      else {
        if (im483i.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"im483i",7);
        }
        else {
          sprintf(szTemp,"%.127s",im483i.szCfgFilePath);
        }
        sVar5 = strlen(szTemp);
        iVar7 = (int)sVar5 + 1;
        uVar8 = sVar5 & 0xffffffff;
        do {
          if ((int)uVar8 < 1) goto LAB_0018b8d8;
          uVar1 = uVar8 - 1;
          iVar7 = iVar7 + -1;
          lVar3 = uVar8 - 1;
          uVar8 = uVar1;
        } while (szTemp[lVar3] != '.');
        if ((uVar1 != 0) && (iVar7 <= (int)sVar5)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar5 - (uVar1 & 0xffffffff));
        }
LAB_0018b8d8:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar6 = strtimeex_fns();
        bVar2 = false;
        sprintf(szSaveFilePath,"log/%.127s_%.64s.txt",szTemp,pcVar6);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        im483i.pfSaveFile = (FILE *)fopen(szSaveFilePath,"wb");
        bVar10 = true;
        if ((FILE *)im483i.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create IM483I data file.");
          bVar2 = false;
          goto LAB_0018ba65;
        }
      }
    }
LAB_0018b93c:
    if (bExit != 0) {
LAB_0018ba65:
      StopChronoQuick(&chrono_period);
      StopChronoQuick(&chrono_sail_calibration);
      if (im483i.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)im483i.pfSaveFile);
        im483i.pfSaveFile = (FILE *)0x0;
      }
      if (!bVar2) {
        DisconnectIM483I(&im483i);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I im483i;
	double angle = 0;
	CHRONO chrono_sail_calibration;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&im483i, 0, sizeof(IM483I));

	StartChrono(&chrono_sail_calibration);

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseIM483I) 
		{
			if (bConnected)
			{
				printf("IM483I paused.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartIM483I) 
		{
			if (bConnected)
			{
				printf("Restarting a IM483I.\n");
				bConnected = FALSE;
				DisconnectIM483I(&im483i);
			}
			bRestartIM483I = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectIM483I(&im483i, "IM483I0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = im483i.threadperiod;

				//EnterCriticalSection(&StateVariablesCS);
				bSailCalibrated = FALSE;
				//LeaveCriticalSection(&StateVariablesCS);

				if (im483i.pfSaveFile != NULL)
				{
					fclose(im483i.pfSaveFile); 
					im483i.pfSaveFile = NULL;
				}
				if ((im483i.bSaveRawData)&&(im483i.pfSaveFile == NULL)) 
				{
					if (strlen(im483i.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", im483i.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "im483i");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					im483i.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (im483i.pfSaveFile == NULL) 
					{
						printf("Unable to create IM483I data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case SAILBOAT_ROBID: // For VSim compatibility...
			case SAILBOAT2_ROBID: // For VSim compatibility...
			case VAIMOS_ROBID:
				if ((GetTimeElapsedChronoQuick(&chrono_sail_calibration) > sail_calibration_period)||
					((bCalibrateSail)&&(!bSailCalibrated))||
					(bForceSailCalibration))
				{
					if ((bCalibrateSail)&&(!bSailCalibrated))
					{
						if (bCheckRudder) mSleep(7000); // Wait for the rudder check...
					}
					bSailCalibrated = FALSE;
					if (CalibrateMotorIM483I(&im483i) != EXIT_SUCCESS)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					bSailCalibrated = TRUE;
					bForceSailCalibration = FALSE;
					StopChronoQuick(&chrono_sail_calibration);
					StartChrono(&chrono_sail_calibration);
				}
				EnterCriticalSection(&StateVariablesCS);
				//angle = deltasmax;
				if (u_f > 0) angle = u_f*(im483i.MaxAngle-im483i.MinAngle)+im483i.MinAngle; else angle = im483i.MinAngle;
				LeaveCriticalSection(&StateVariablesCS);
				//if ((!im483i.bNoContinuousUpdateMaxAngle)||(bUpdateMaxAngleIM483I)) { ... bUpdateMaxAngleIM483I = FALSE; }
				i = 0;
				while (SetMaxAngleIM483I(&im483i, angle) != EXIT_SUCCESS)
				{
					if (i > 4)
					{
						printf("Connection to a IM483I lost.\n");
						bSailCalibrated = FALSE;
						bConnected = FALSE;
						DisconnectIM483I(&im483i);
						break;
					}
					mSleep(im483i.timeout);
					i++;
				}
				break;
			default:
				break;
			}
		}

		//printf("IM483IThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	StopChronoQuick(&chrono_sail_calibration);

	if (im483i.pfSaveFile != NULL)
	{
		fclose(im483i.pfSaveFile); 
		im483i.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectIM483I(&im483i);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}